

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O0

compile_errcode __thiscall CompoundStatement::Action(CompoundStatement *this)

{
  SymbolName SVar1;
  compile_errcode cVar2;
  SymbolName name;
  int ret;
  CompoundStatement *this_local;
  
  SVar1 = SymbolQueue::GetCurrentName(handle_correct_queue);
  if ((SVar1 == CONST_SYM) &&
     (cVar2 = ConstantDeclaration::Action(&this->m_constant_declaration), cVar2 == 0)) {
    ConstantDeclaration::LogOutput(&this->m_constant_declaration);
  }
  cVar2 = VariableDeclaration::Action(&this->m_variable_declaration);
  if (cVar2 == 0) {
    VariableDeclaration::LogOutput(&this->m_variable_declaration);
  }
  StatementList::Action(&this->m_statement_list);
  return 0;
}

Assistant:

compile_errcode CompoundStatement::Action() {
    int ret = COMPILE_OK;
    SymbolName name = handle_correct_queue->GetCurrentName();
    if (name == CONST_SYM) {
        if ((ret = m_constant_declaration.Action()) == COMPILE_OK) {
            m_constant_declaration.LogOutput();
        }
    }
    if ((ret = m_variable_declaration.Action()) == COMPILE_OK) {
        m_variable_declaration.LogOutput();
    }
    m_statement_list.Action();
    return COMPILE_OK;
}